

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O0

bool hashSearch<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *vals,string *hash_str,string *map_name,string *default_value,
               uint8_t expansion,uint8_t reduction,bool nonKeyLookups)

{
  value_type vVar1;
  uint uVar2;
  ulong uVar3;
  _Bit_pointer puVar4;
  bool bVar5;
  value_type vVar6;
  uint32_t uVar7;
  size_type sVar8;
  size_type sVar9;
  reference pvVar10;
  unsigned_long uVar11;
  const_reference pvVar12;
  reference pvVar13;
  const_reference pvVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  char *local_1c8;
  char *local_1c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_1a8 [8];
  string upper_name;
  string local_168;
  string local_148;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_f0;
  ulong local_d0;
  size_t i;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> mapping;
  uint uStack_a0;
  uint uStack_9c;
  uint8_t num_c;
  array<unsigned_int,_6UL> best_c;
  uint8_t best_num_c;
  allocator<bool> local_72;
  bool local_71;
  undefined1 local_70 [8];
  vector<bool,_std::allocator<bool>_> hash_table;
  size_t n;
  bool nonKeyLookups_local;
  uint8_t expansion_local;
  string *default_value_local;
  string *map_name_local;
  string *hash_str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vals_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(keys);
  if (sVar8 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x84,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  bVar5 = hasDuplicates<std::__cxx11::string>(keys);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x85,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(vals);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(keys);
  if (sVar8 == sVar9) {
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(keys);
    hash_table.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)getModulusBitmask((sVar8 * expansion) / (ulong)reduction);
    sVar8 = (long)hash_table.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage + 1;
    local_71 = false;
    std::allocator<bool>::allocator(&local_72);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_70,sVar8,&local_71,&local_72);
    std::allocator<bool>::~allocator(&local_72);
    sVar8 = std::array<unsigned_int,_6UL>::size(&c);
    best_c._M_elems[4]._3_1_ = (char)sVar8 + 1;
    pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_min,0);
    vVar1 = *pvVar10;
    pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,0);
    *pvVar10 = vVar1;
    while( true ) {
      pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,0);
      uVar2 = *pvVar10;
      pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_max,0);
      if (*pvVar10 < uVar2) break;
      pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_min,1);
      vVar1 = *pvVar10;
      pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,1);
      *pvVar10 = vVar1;
      while( true ) {
        pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,1);
        uVar2 = *pvVar10;
        pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_max,1);
        if (*pvVar10 < uVar2) break;
        pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_min,2);
        vVar1 = *pvVar10;
        pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,2);
        *pvVar10 = vVar1;
        while( true ) {
          pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,2);
          uVar2 = *pvVar10;
          pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_max,2);
          if (*pvVar10 < uVar2) break;
          pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_min,3);
          vVar1 = *pvVar10;
          pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,3);
          *pvVar10 = vVar1;
          while( true ) {
            pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,3);
            uVar2 = *pvVar10;
            pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_max,3);
            if (*pvVar10 < uVar2) break;
            pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_min,4);
            vVar1 = *pvVar10;
            pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,4);
            *pvVar10 = vVar1;
            while( true ) {
              pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,4);
              uVar2 = *pvVar10;
              pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_max,4);
              if (*pvVar10 < uVar2) break;
              pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_min,5);
              vVar1 = *pvVar10;
              pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,5);
              *pvVar10 = vVar1;
              while( true ) {
                pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,5);
                uVar2 = *pvVar10;
                pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c_max,5);
                if (*pvVar10 < uVar2) break;
                mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ = checkNonzeroCoeffs();
                if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._7_1_ < best_c._M_elems[4]._3_1_) {
                  bVar5 = hasCollisions<std::__cxx11::string>
                                    (keys,(size_t)hash_table.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_end_of_storage,
                                     (vector<bool,_std::allocator<bool>_> *)local_70);
                  if (!bVar5) {
                    best_c._M_elems[4]._3_1_ =
                         mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._7_1_;
                    uStack_a0 = c._M_elems[0];
                    uStack_9c = c._M_elems[1];
                    best_c._M_elems[0] = c._M_elems[2];
                    best_c._M_elems[1] = c._M_elems[3];
                    best_c._M_elems[2] = c._M_elems[4];
                    best_c._M_elems[3] = c._M_elems[5];
                  }
                }
                pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,5);
                *pvVar10 = *pvVar10 + 1;
              }
              pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,4);
              *pvVar10 = *pvVar10 + 1;
            }
            pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,3);
            *pvVar10 = *pvVar10 + 1;
          }
          pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,2);
          *pvVar10 = *pvVar10 + 1;
        }
        pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,1);
        *pvVar10 = *pvVar10 + 1;
      }
      pvVar10 = std::array<unsigned_int,_6UL>::operator[](&c,0);
      *pvVar10 = *pvVar10 + 1;
    }
    sVar8 = std::array<unsigned_int,_6UL>::size(&c);
    if ((ulong)best_c._M_elems[4]._3_1_ == sVar8 + 1) {
      keys_local._7_1_ = false;
      mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    else {
      c._M_elems[4] = best_c._M_elems[2];
      c._M_elems[5] = best_c._M_elems[3];
      c._M_elems[0] = uStack_a0;
      c._M_elems[1] = uStack_9c;
      c._M_elems[2] = best_c._M_elems[0];
      c._M_elems[3] = best_c._M_elems[1];
      sVar8 = (long)hash_table.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + 1;
      i._4_4_ = 0xffffffff;
      std::allocator<int>::allocator((allocator<int> *)((long)&i + 3));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_c0,sVar8,
                 (value_type_conflict4 *)((long)&i + 4),(allocator<int> *)((long)&i + 3));
      std::allocator<int>::~allocator((allocator<int> *)((long)&i + 3));
      local_d0 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(keys);
      while( true ) {
        local_d0 = local_d0 - 1;
        uVar3 = local_d0;
        uVar11 = std::numeric_limits<unsigned_long>::max();
        if (uVar11 <= uVar3) break;
        vVar6 = (value_type)local_d0;
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](keys,local_d0);
        uVar7 = hash(pvVar12);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_c0,
                             (ulong)uVar7 &
                             (ulong)hash_table.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_end_of_storage);
        *pvVar13 = vVar6;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108,vals);
      puVar4 = hash_table.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)&local_128,(string *)map_name);
      getCommonCodeGen<std::__cxx11::string>
                (&local_f0,keys,&local_108,(vector<int,_std::allocator<int>_> *)local_c0,
                 (size_t)puVar4,&local_128,nonKeyLookups);
      std::__cxx11::string::operator=((string *)hash_str,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](keys,0);
      puVar4 = hash_table.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)&local_168,(string *)map_name);
      pvVar14 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](keys,0);
      typeStr((string *)((long)&upper_name.field_2 + 8),pvVar14);
      hashStr(&local_148,pvVar12,(size_t)puVar4,default_value,&local_168,
              (string *)((long)&upper_name.field_2 + 8),nonKeyLookups);
      std::__cxx11::string::operator+=((string *)hash_str,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)(upper_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::string((string *)local_1a8,(string *)map_name);
      local_1b0._M_current = (char *)std::__cxx11::string::begin();
      local_1b8._M_current = (char *)std::__cxx11::string::end();
      local_1c0 = (char *)std::__cxx11::string::begin();
      local_1c8 = (char *)std::
                          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                    (local_1b0,local_1b8,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_1c0,toupper);
      std::operator+(&local_208,"#endif // POIFECT_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
      ;
      std::operator+(&local_1e8,&local_208,"_H\n");
      std::__cxx11::string::operator+=((string *)hash_str,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      keys_local._7_1_ = true;
      mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      std::__cxx11::string::~string((string *)local_1a8);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0)
      ;
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_70);
    return keys_local._7_1_;
  }
  __assert_fail("vals.size() == keys.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                ,0x86,
                "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
               );
}

Assistant:

bool hashSearch(const std::vector<KeyType>& keys,
                const std::vector<std::string>& vals,
                std::string& hash_str,
                std::string map_name = "PoifectMap",
                std::string default_value = "",
                uint8_t expansion = 1,
                uint8_t reduction = 1,
                bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    size_t n = getModulusBitmask(keys.size() * expansion / reduction);
    std::vector<bool> hash_table(n+1, false);
    uint8_t best_num_c = c.size()+1;
    std::array<uint32_t, c.size()> best_c;

    #define ITERATE_INDEX(i) for(c[i] = c_min[i]; c[i] <= c_max[i]; c[i]++)

    ITERATE_INDEX(0)
    ITERATE_INDEX(1)
    ITERATE_INDEX(2)
    ITERATE_INDEX(3)
    ITERATE_INDEX(4)
    ITERATE_INDEX(5)
    {
        const uint8_t num_c = checkNonzeroCoeffs();
        if(num_c < best_num_c && !hasCollisions(keys, n, hash_table)){
            best_num_c = num_c;
            best_c = c;
        }
    }

    if(best_num_c == c.size()+1) return false;

    c = best_c;
    std::vector<int> mapping(n+1, -1);
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        mapping[hash(keys[i])&n] = i;

    hash_str = getCommonCodeGen(keys, vals, mapping, n, map_name, nonKeyLookups);

    hash_str += hashStr(keys[0], n, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";

    return true;
}